

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::quatd> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quatd>
          (optional<tinyusdz::value::quatd> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  quatd value;
  optional<tinyusdz::value::quatd> local_48;
  
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatd>
                      (this_00,t,interp,(quatd *)&local_48);
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_48.contained._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_48.contained._16_8_;
    }
    else {
      __return_storage_ptr__->has_value_ = false;
      local_48.has_value_ = false;
      local_48._1_3_ = 0;
      local_48._4_4_ = 0;
      local_48.contained._0_4_ = 0;
      local_48.contained._4_4_ = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    }
    *(undefined4 *)&__return_storage_ptr__->contained = local_48._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_48._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_48.contained._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_48.contained._4_4_;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quatd>(&local_48,this_00);
    __return_storage_ptr__->has_value_ = local_48.has_value_;
    if (local_48.has_value_ == true) {
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_48.contained._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_48.contained._24_8_;
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_48.contained._4_4_,local_48.contained._0_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_48.contained._8_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }